

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

float If_CutEdgeFlow(If_Man_t *p,If_Cut_t *pCut)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = *(uint *)&pCut->field_0x1c >> 0x18;
  fVar4 = (float)uVar2;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar3 = 0;
    fVar5 = fVar4;
    do {
      fVar4 = (&pCut[1].Area)[uVar3];
      if (((long)(int)fVar4 < 0) || (p->vObjs->nSize <= (int)fVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)p->vObjs->pArray[(int)fVar4];
      if (puVar1 == (uint *)0x0) {
        return fVar5;
      }
      if ((puVar1[3] == 0) || ((*puVar1 & 0xf) == 1)) {
        fVar6 = (float)puVar1[0x15];
      }
      else {
        fVar6 = (float)puVar1[0xc];
        if (fVar6 < p->fEpsilon || fVar6 == p->fEpsilon) {
          __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x3c9,"float If_CutEdgeFlow(If_Man_t *, If_Cut_t *)");
        }
        fVar6 = (float)puVar1[0x15] / fVar6;
      }
      fVar4 = 1e+32;
      if (((fVar5 < 1e+32) && (fVar4 = 1e+32, fVar6 < 1e+32)) &&
         (fVar4 = fVar5 + fVar6, 1e+32 < fVar4)) {
        fVar4 = 1e+32;
      }
      uVar3 = uVar3 + 1;
      fVar5 = fVar4;
    } while (uVar2 != uVar3);
  }
  return fVar4;
}

Assistant:

float If_CutEdgeFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow, AddOn;
    int i;
    Flow = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            AddOn = If_ObjCutBest(pLeaf)->Edge;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            AddOn = If_ObjCutBest(pLeaf)->Edge / pLeaf->EstRefs;
        }
        if ( Flow >= (float)1e32 || AddOn >= (float)1e32 )
            Flow = (float)1e32;
        else 
        {
            Flow += AddOn;
            if ( Flow > (float)1e32 )
                 Flow = (float)1e32;
        }
    }
    return Flow;
}